

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  char cVar1;
  uint uVar2;
  DTableDesc DVar3;
  U32 UVar4;
  int iVar5;
  U32 UVar6;
  ulong uVar7;
  U64 UVar8;
  U32 *in_RCX;
  HUF_DTable *in_RDI;
  ulong in_R8;
  undefined4 in_R9D;
  U64 D4_2;
  U64 D4_1;
  U64 D4;
  HUF_DEltX1 D_1;
  HUF_DEltX1 D;
  int u_1;
  int s;
  BYTE nbBits;
  int uStart;
  int length;
  int symbolCount;
  int rankStart;
  int symbol;
  U32 w_2;
  size_t w_1;
  size_t w;
  int u;
  U32 curr;
  int nLimit;
  int unroll;
  U32 nextRankStart;
  int n;
  U32 targetTableLog;
  U32 maxTableLog;
  DTableDesc dtd;
  HUF_ReadDTableX1_Workspace *wksp;
  HUF_DEltX1 *dt;
  void *dtPtr;
  size_t iSize;
  U32 nbSymbols;
  U32 tableLog;
  BYTE nbBits_00;
  BYTE symbol_00;
  undefined4 in_stack_ffffffffffffff14;
  U32 *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  U32 *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  BYTE *in_stack_ffffffffffffff38;
  undefined2 local_c0;
  undefined2 local_be;
  int local_bc;
  int local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  U32 UVar9;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar10;
  int iVar11;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int local_84;
  U32 local_74;
  int local_70;
  undefined4 local_64;
  size_t local_8;
  
  if (in_R8 < 0x5d4) {
    local_8 = 0xffffffffffffffd4;
  }
  else {
    local_8 = HUF_readStats_wksp(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff28,
                                 (U32 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ),in_stack_ffffffffffffff18,
                                 (void *)CONCAT44(in_stack_ffffffffffffff14,in_R9D),
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (void *)CONCAT44(in_stack_ffffffffffffff5c,
                                                  in_stack_ffffffffffffff58),
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff68);
    uVar2 = ERR_isError(local_8);
    if (uVar2 == 0) {
      DVar3 = HUF_getDTableDesc(in_RDI);
      uVar2 = ((uint)DVar3 & 0xff) + 1;
      if (10 < uVar2) {
        uVar2 = 0xb;
      }
      UVar4 = HUF_rescaleStats((BYTE *)(in_RCX + 0x135),in_RCX,0,0,uVar2);
      if (((uint)DVar3 & 0xff) + 1 < UVar4) {
        local_8 = 0xffffffffffffffd4;
      }
      else {
        local_64._0_2_ = (ushort)DVar3.maxTableLog;
        local_64._3_1_ = DVar3.reserved;
        local_64._0_3_ = CONCAT12((char)UVar4,(ushort)local_64);
        *in_RDI = local_64;
        local_74 = 0;
        for (local_70 = 0; local_70 < (int)(UVar4 + 1); local_70 = local_70 + 1) {
          UVar6 = in_RCX[local_70];
          in_RCX[(long)local_70 + 0xd] = local_74;
          local_74 = UVar6 + local_74;
        }
        for (local_70 = 0; local_70 < -3; local_70 = local_70 + 4) {
          for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
            uVar7 = (ulong)*(byte *)((long)in_RCX + (long)(local_70 + local_84) + 0x4d4);
            uVar2 = in_RCX[uVar7 + 0xd];
            in_RCX[uVar7 + 0xd] = uVar2 + 1;
            *(char *)((long)in_RCX + (ulong)uVar2 + 0x3d4) = (char)local_70 + (char)local_84;
          }
        }
        for (; local_70 < 0; local_70 = local_70 + 1) {
          uVar7 = (ulong)*(byte *)((long)in_RCX + (long)local_70 + 0x4d4);
          uVar2 = in_RCX[uVar7 + 0xd];
          in_RCX[uVar7 + 0xd] = uVar2 + 1;
          *(char *)((long)in_RCX + (ulong)uVar2 + 0x3d4) = (char)local_70;
        }
        UVar6 = *in_RCX;
        iVar10 = 0;
        for (uVar2 = 1; uVar2 < UVar4 + 1; uVar2 = uVar2 + 1) {
          UVar9 = in_RCX[uVar2];
          iVar5 = (1 << ((byte)uVar2 & 0x1f)) >> 1;
          cVar1 = ((char)UVar4 - (byte)uVar2) + '\x01';
          nbBits_00 = (BYTE)((ulong)(in_RCX + 0x1a) >> 0x30);
          symbol_00 = (BYTE)((ulong)(in_RCX + 0x1a) >> 0x38);
          iVar11 = iVar10;
          switch(iVar5) {
          case 1:
            for (local_b8 = 0; local_b8 < (int)UVar9; local_b8 = local_b8 + 1) {
              local_be = CONCAT11(*(undefined1 *)
                                   ((long)in_RCX + (long)(int)(UVar6 + local_b8) + 0x3d4),cVar1);
              *(undefined2 *)((long)in_RDI + (long)iVar10 * 2 + 4) = local_be;
              iVar10 = iVar10 + 1;
            }
            break;
          case 2:
            for (local_b8 = 0; local_b8 < (int)UVar9; local_b8 = local_b8 + 1) {
              local_c0 = CONCAT11(*(undefined1 *)
                                   ((long)in_RCX + (long)(int)(UVar6 + local_b8) + 0x3d4),cVar1);
              *(undefined2 *)((long)in_RDI + (long)iVar10 * 2 + 4) = local_c0;
              *(undefined2 *)((long)in_RDI + (long)(iVar10 + 1) * 2 + 4) = local_c0;
              iVar10 = iVar10 + 2;
            }
            break;
          default:
            for (local_b8 = 0; local_b8 < (int)UVar9; local_b8 = local_b8 + 1) {
              UVar8 = HUF_DEltX1_set4(symbol_00,nbBits_00);
              for (local_bc = 0; local_bc < iVar5; local_bc = local_bc + 0x10) {
                MEM_write64((void *)((long)in_RDI + (long)local_bc * 2 + (long)iVar10 * 2 + 4),UVar8
                           );
                MEM_write64((void *)((long)in_RDI + (long)local_bc * 2 + (long)iVar10 * 2 + 0xc),
                            UVar8);
                MEM_write64((void *)((long)in_RDI + (long)local_bc * 2 + (long)iVar10 * 2 + 0x14),
                            UVar8);
                MEM_write64((void *)((long)in_RDI + (long)local_bc * 2 + (long)iVar10 * 2 + 0x1c),
                            UVar8);
              }
              if (local_bc != iVar5) {
                __assert_fail("u == length",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8e17,
                              "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                             );
              }
              iVar10 = iVar5 + iVar10;
            }
            break;
          case 4:
            for (local_b8 = 0; local_b8 < (int)UVar9; local_b8 = local_b8 + 1) {
              UVar8 = HUF_DEltX1_set4(symbol_00,nbBits_00);
              MEM_write64((void *)((long)in_RDI + (long)iVar10 * 2 + 4),UVar8);
              iVar10 = iVar10 + 4;
            }
            break;
          case 8:
            for (local_b8 = 0; local_b8 < (int)UVar9; local_b8 = local_b8 + 1) {
              UVar8 = HUF_DEltX1_set4(symbol_00,nbBits_00);
              MEM_write64((void *)((long)in_RDI + (long)iVar10 * 2 + 4),UVar8);
              MEM_write64((void *)((long)in_RDI + (long)iVar10 * 2 + 0xc),UVar8);
              iVar10 = iVar10 + 8;
            }
          }
          UVar6 = UVar9 + UVar6;
          iVar10 = UVar9 * iVar5 + iVar11;
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}